

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O0

void __thiscall
Diligent::VariableSizeAllocationsManager::VariableSizeAllocationsManager
          (VariableSizeAllocationsManager *this,CreateInfo *CI)

{
  STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>
  local_58;
  STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>
  local_38;
  CreateInfo *local_18;
  CreateInfo *CI_local;
  VariableSizeAllocationsManager *this_local;
  
  local_18 = CI;
  CI_local = (CreateInfo *)this;
  STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>
  ::STDAllocator(&local_38,CI->Allocator,"Allocator for map<OffsetType, FreeBlockInfo>",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x6d);
  std::
  map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
  ::map(&this->m_FreeBlocksByOffset,&local_38);
  STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>
  ::STDAllocator(&local_58,local_18->Allocator,
                 "Allocator for multimap<OffsetType, TFreeBlocksByOffsetMap::iterator>",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x6e);
  std::
  multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
  ::multimap(&this->m_FreeBlocksBySize,&local_58);
  this->m_MaxSize = local_18->MaxSize;
  this->m_FreeSize = local_18->MaxSize;
  this->m_CurrAlignment = 0;
  this->m_DbgDisableDebugValidation = (bool)(local_18->DbgDisableDebugValidation & 1);
  AddNewBlock(this,0,this->m_MaxSize);
  ResetCurrAlignment(this);
  DbgVerifyList(this);
  return;
}

Assistant:

explicit VariableSizeAllocationsManager(const CreateInfo& CI)
        // clang-format off
        : m_FreeBlocksByOffset{STD_ALLOCATOR_RAW_MEM(TFreeBlocksByOffsetMap::value_type, CI.Allocator, "Allocator for map<OffsetType, FreeBlockInfo>")}
        , m_FreeBlocksBySize  {STD_ALLOCATOR_RAW_MEM(TFreeBlocksBySizeMap::value_type,   CI.Allocator, "Allocator for multimap<OffsetType, TFreeBlocksByOffsetMap::iterator>")}
        , m_MaxSize {CI.MaxSize}
        , m_FreeSize{CI.MaxSize}
#ifdef DILIGENT_DEBUG
        , m_DbgDisableDebugValidation{CI.DbgDisableDebugValidation}
#endif
    // clang-format on
    {
        // Insert single maximum-size block
        AddNewBlock(0, m_MaxSize);
        ResetCurrAlignment();

#ifdef DILIGENT_DEBUG
        DbgVerifyList();
#endif
    }